

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

date_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMicrosBinaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t>
          (WidthConvertibleToMicrosBinaryOperator *this,interval_t bucket_width,date_t ts)

{
  bool bVar1;
  int64_t right;
  int64_t left;
  long lVar2;
  timestamp_t tVar3;
  date_t input;
  long right_00;
  long left_00;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  date_t result;
  timestamp_t local_50;
  string local_48;
  WidthConvertibleToMicrosBinaryOperator *local_28;
  int64_t local_20;
  
  local_20 = bucket_width._0_8_;
  input.days = bucket_width.micros._0_4_;
  local_28 = this;
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    right = Interval::GetMicro((interval_t *)&local_28);
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,&local_50,false);
    if (!bVar1) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_48,(duckdb *)(ulong)(uint)input.days,(date_t)auVar4._8_4_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    tVar3.value._4_4_ = local_50.value._4_4_;
    tVar3.value._0_4_ = (int32_t)local_50.value;
    left = Timestamp::GetEpochMicroSeconds(tVar3);
    right_00 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x35d2976e6a000)) % SEXT816(right),0);
    lVar2 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,right_00);
    left_00 = lVar2 - lVar2 % right;
    if (lVar2 % right != 0 && lVar2 < 0) {
      left_00 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left_00,right);
    }
    tVar3 = Timestamp::FromEpochMicroSeconds(left_00 + right_00);
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>(tVar3,(date_t *)&local_50,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                (&local_48,(duckdb *)tVar3.value,(timestamp_t)auVar5._8_8_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_48);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(input,(date_t *)&local_50,false);
    if (!bVar1) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_48,(duckdb *)(ulong)(uint)input.days,(date_t)auVar4._8_4_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (date_t)(int32_t)local_50.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS));
		}